

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

void __thiscall Channel::update_2_KON1_BLOCK3_FNUMH2(Channel *this,OPL3 *OPL3)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = OPL3->registers[(long)this->channelBaseAddress + 0xb0];
  this->block = bVar1 >> 2 & 7;
  this->fnumh = bVar1 & 3;
  (*this->_vptr_Channel[5])();
  uVar2 = bVar1 >> 5 & 1;
  if (uVar2 != this->kon) {
    (*this->_vptr_Channel[(ulong)((bVar1 >> 5 & 1) == 0) + 3])(this);
    this->kon = uVar2;
  }
  return;
}

Assistant:

void Channel::update_2_KON1_BLOCK3_FNUMH2(OPL3 *OPL3) {
	
	int _2_kon1_block3_fnumh2 = OPL3->registers[channelBaseAddress+ChannelData::_2_KON1_BLOCK3_FNUMH2_Offset];
	
	// Frequency Number (hi-register) and Block. These two registers, together with fnuml, 
	// sets the Channel´s base frequency;
	block = (_2_kon1_block3_fnumh2 & 0x1C) >> 2;
	fnumh = _2_kon1_block3_fnumh2 & 0x03;        
	updateOperators(OPL3);
	
	// Key On. If changed, calls Channel.keyOn() / keyOff().
	int newKon   = (_2_kon1_block3_fnumh2 & 0x20) >> 5;
	if(newKon != kon) {
		if(newKon == 1) keyOn();
		else keyOff();
		kon = newKon;
	}
}